

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode cf_he_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  Curl_cfilter *pCVar1;
  long *plVar2;
  uint uVar3;
  int iVar4;
  CURLcode CVar5;
  long lVar6;
  int reply_ms;
  uint uVar7;
  curltime *when;
  bool bVar8;
  bool bVar9;
  curltime cVar10;
  int breply_ms;
  uint local_3c;
  uint *local_38;
  
  if ((cf->field_0x24 & 1) == 0) {
    pCVar1 = (Curl_cfilter *)cf->ctx;
    if (query == 5) {
      iVar4 = 5;
    }
    else {
      if (query != 4) {
        if (query == 2) {
          uVar7 = 0xffffffff;
          lVar6 = 0;
          bVar9 = true;
          local_38 = (uint *)pres1;
          do {
            bVar8 = bVar9;
            lVar6 = *(long *)(&pCVar1->sockindex + lVar6 * 2);
            if (((lVar6 != 0) && (plVar2 = *(long **)(lVar6 + 0x28), plVar2 != (long *)0x0)) &&
               (iVar4 = (**(code **)(*plVar2 + 0x68))(plVar2,data,2,&local_3c,0),
               -1 < (int)local_3c && iVar4 == 0)) {
              uVar3 = uVar7;
              if ((int)local_3c < (int)uVar7) {
                uVar3 = local_3c;
              }
              bVar9 = (int)uVar7 < 0;
              uVar7 = uVar3;
              if (bVar9) {
                uVar7 = local_3c;
              }
            }
            lVar6 = 1;
            bVar9 = false;
          } while (bVar8);
          *local_38 = uVar7;
          if (data == (Curl_easy *)0x0) {
            return CURLE_OK;
          }
          if (cf == (Curl_cfilter *)0x0) {
            return CURLE_OK;
          }
          if ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) == 0) {
            return CURLE_OK;
          }
          if (cf->cft->log_level < 1) {
            return CURLE_OK;
          }
          Curl_trc_cf_infof(data,cf,"query connect reply: %dms",(ulong)uVar7);
          return CURLE_OK;
        }
        goto LAB_0068d458;
      }
      iVar4 = 4;
    }
    cVar10 = get_max_baller_time(pCVar1,data,iVar4);
    *(time_t *)pres2 = cVar10.tv_sec;
    *(int *)((long)pres2 + 8) = cVar10.tv_usec;
    CVar5 = CURLE_OK;
  }
  else {
LAB_0068d458:
    pCVar1 = cf->next;
    if (pCVar1 != (Curl_cfilter *)0x0) {
      CVar5 = (*pCVar1->cft->query)(pCVar1,data,query,pres1,pres2);
      return CVar5;
    }
    CVar5 = CURLE_UNKNOWN_OPTION;
  }
  return CVar5;
}

Assistant:

static CURLcode cf_he_query(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int query, int *pres1, void *pres2)
{
  struct cf_he_ctx *ctx = cf->ctx;

  if(!cf->connected) {
    switch(query) {
    case CF_QUERY_CONNECT_REPLY_MS: {
      int reply_ms = -1;
      size_t i;

      for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
        struct eyeballer *baller = ctx->baller[i];
        int breply_ms;

        if(baller && baller->cf &&
           !baller->cf->cft->query(baller->cf, data, query,
                                   &breply_ms, NULL)) {
          if(breply_ms >= 0 && (reply_ms < 0 || breply_ms < reply_ms))
            reply_ms = breply_ms;
        }
      }
      *pres1 = reply_ms;
      CURL_TRC_CF(data, cf, "query connect reply: %dms", *pres1);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_CONNECT: {
      struct curltime *when = pres2;
      *when = get_max_baller_time(cf, data, CF_QUERY_TIMER_CONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_APPCONNECT: {
      struct curltime *when = pres2;
      *when = get_max_baller_time(cf, data, CF_QUERY_TIMER_APPCONNECT);
      return CURLE_OK;
    }
    default:
      break;
    }
  }

  return cf->next?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}